

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.h
# Opt level: O0

void __thiscall
embree::Application::parseCommandLine
          (Application *this,Ref<embree::ParseStream> *cin,FileName *path)

{
  long *in_RSI;
  FileName *in_stack_000000e8;
  Ref<embree::ParseStream> *in_stack_000000f0;
  CommandLineParser *in_stack_000000f8;
  long *local_40 [5];
  long **local_18;
  long **local_10;
  
  local_18 = local_40;
  local_40[0] = (long *)*in_RSI;
  if (local_40[0] != (long *)0x0) {
    (**(code **)(*local_40[0] + 0x10))();
  }
  CommandLineParser::parseCommandLine(in_stack_000000f8,in_stack_000000f0,in_stack_000000e8);
  local_10 = local_40;
  if (local_40[0] != (long *)0x0) {
    (**(code **)(*local_40[0] + 0x18))();
  }
  return;
}

Assistant:

void parseCommandLine(Ref<ParseStream> cin, const FileName& path) {
      commandLineParser.parseCommandLine(cin, path);
    }